

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall testing::Matcher<const_int_&>::Matcher(Matcher<const_int_&> *this,int *value)

{
  MatcherBase<const_int_&> local_28;
  
  (this->super_MatcherBase<const_int_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_int_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_01873d40;
  local_28.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::EqMatcher<int>,true>>()
       ::kVTable;
  local_28.buffer_.i._4_4_ = 0;
  local_28.buffer_.i._0_4_ = *value;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_01873d40;
  testing::internal::MatcherBase<const_int_&>::operator=
            (&this->super_MatcherBase<const_int_&>,&local_28);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}